

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_execute(lua_State *L)

{
  lua_CFunction *pp_Var1;
  double dVar2;
  byte bVar3;
  lua_CFunction p_Var4;
  StkId pTVar5;
  CallInfo *pCVar6;
  Instruction *pIVar7;
  global_State *p;
  Upvaldesc *pUVar8;
  Value *pVVar9;
  StkId pTVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  TValue *pTVar14;
  uint *puVar15;
  int *piVar16;
  StkId pTVar17;
  code *pcVar18;
  GCObject *pGVar19;
  UpVal *pUVar20;
  uint uVar21;
  TValue *io2_3;
  ulong uVar22;
  StkId pTVar23;
  TValue *rb;
  long lVar24;
  byte bVar25;
  uint uVar26;
  TValue *io1;
  TValue *pTVar27;
  ulong uVar28;
  char *fmt;
  TMS op;
  StkId pTVar29;
  TValue *io;
  int a;
  uint uVar30;
  StkId pTVar31;
  long lVar32;
  CallInfo *pCVar33;
  uint uVar34;
  double dVar35;
  lua_Number lVar36;
  double dVar37;
  
  pCVar33 = L->ci;
  do {
    pTVar29 = (pCVar33->u).l.base;
    p_Var4 = (pCVar33->func->value_).f;
    pTVar5 = *(StkId *)(*(long *)(p_Var4 + 0x18) + 0x10);
    do {
      puVar15 = (pCVar33->u).l.savedpc;
      (pCVar33->u).l.savedpc = puVar15 + 1;
      uVar34 = *puVar15;
      bVar3 = L->hookmask;
      if ((bVar3 & 0xc) != 0) {
        iVar12 = L->hookcount + -1;
        L->hookcount = iVar12;
        if ((bVar3 & 4) != 0 || iVar12 == 0) {
          bVar25 = bVar3 >> 3 & iVar12 == 0;
          if (bVar25 == 1) {
            L->hookcount = L->basehookcount;
          }
          pCVar6 = L->ci;
          if ((char)pCVar6->callstatus < '\0') {
            pCVar6->callstatus = pCVar6->callstatus & 0x7f;
          }
          else {
            if (bVar25 != 0) {
              luaD_hook(L,3,-1);
            }
            if ((bVar3 & 4) != 0) {
              pIVar7 = (pCVar6->u).l.savedpc;
              lVar32 = *(long *)((pCVar6->func->value_).f + 0x18);
              lVar24 = *(long *)(lVar32 + 0x18);
              lVar32 = *(long *)(lVar32 + 0x28);
              iVar12 = (int)((ulong)((long)pIVar7 - lVar24) >> 2) + -1;
              if (lVar32 == 0) {
                iVar13 = 0;
              }
              else {
                iVar13 = *(int *)(lVar32 + (long)iVar12 * 4);
              }
              if ((iVar12 != 0) && (L->oldpc < pIVar7)) {
                if (lVar32 == 0) {
                  iVar12 = 0;
                }
                else {
                  iVar12 = *(int *)(lVar32 + (((long)L->oldpc - lVar24) * 0x40000000 + -0x100000000
                                             >> 0x20) * 4);
                }
                if (iVar13 == iVar12) goto LAB_00112047;
              }
              luaD_hook(L,2,iVar13);
            }
LAB_00112047:
            L->oldpc = (pCVar6->u).l.savedpc;
            if (L->status == '\x01') {
              if (bVar25 != 0) {
                L->hookcount = 1;
              }
              pp_Var1 = &(pCVar6->u).c.k;
              *pp_Var1 = *pp_Var1 + -4;
              pCVar6->callstatus = pCVar6->callstatus | 0x80;
              pCVar6->func = L->top + -1;
              luaD_throw(L,1);
            }
          }
          pTVar29 = (pCVar33->u).l.base;
        }
      }
      if (0x26 < (uVar34 & 0x3f)) goto LAB_00112e5e;
      uVar21 = uVar34 >> 6;
      pTVar27 = (TValue *)((long)&pTVar29->value_ + (ulong)((uVar21 & 0xff) << 4));
      uVar30 = uVar21 & 0xff;
      uVar26 = uVar21 & 0xff;
      pTVar17 = pTVar29;
      switch(uVar34 & 0x3f) {
      case 0:
        uVar28 = (ulong)(uVar34 >> 0x13 & 0xfffffff0);
        pTVar27->value_ = *(Value *)((long)&pTVar29->value_ + uVar28);
        iVar12 = *(int *)((long)&pTVar29->tt_ + uVar28);
        goto LAB_001127b8;
      case 1:
        uVar28 = (ulong)(uVar34 >> 10 & 0xfffffff0);
        pTVar27->value_ = *(Value *)((long)&pTVar5->value_ + uVar28);
        iVar12 = *(int *)((long)&pTVar5->tt_ + uVar28);
        goto LAB_001127b8;
      case 2:
        puVar15 = (pCVar33->u).l.savedpc;
        (pCVar33->u).l.savedpc = puVar15 + 1;
        uVar28 = (ulong)(*puVar15 >> 2 & 0xfffffff0);
        pTVar27->value_ = *(Value *)((long)&pTVar5->value_ + uVar28);
        iVar12 = *(int *)((long)&pTVar5->tt_ + uVar28);
        goto LAB_001127b8;
      case 3:
        (pTVar27->value_).b = uVar34 >> 0x17;
        pTVar27->tt_ = 1;
        if ((uVar34 & 0x7fc000) != 0) goto LAB_00112640;
        break;
      case 4:
        lVar32 = 0;
        do {
          *(undefined4 *)((long)&pTVar29->tt_ + lVar32 + (ulong)(uVar30 << 4)) = 0;
          lVar32 = lVar32 + 0x10;
        } while ((uVar34 >> 0x13 & 0xfffffff0) + 0x10 != (int)lVar32);
        break;
      case 5:
        pVVar9 = *(Value **)(*(long *)(p_Var4 + (ulong)(uVar34 >> 0x17) * 8 + 0x20) + 0x10);
        pTVar27->value_ = *pVVar9;
        iVar12 = pVVar9[1].b;
LAB_001127b8:
        pTVar27->tt_ = iVar12;
        break;
      case 6:
        if ((uVar34 >> 0x16 & 1) != 0) {
          pTVar29 = pTVar5;
        }
        pTVar14 = *(TValue **)(*(long *)(p_Var4 + (ulong)(uVar34 >> 0x17) * 8 + 0x20) + 0x10);
        pTVar17 = pTVar29;
        goto LAB_0011285a;
      case 7:
        pTVar14 = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((uVar34 >> 0x16 & 1) != 0) {
          pTVar17 = pTVar5;
        }
        goto LAB_0011285a;
      case 8:
        pTVar14 = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          pTVar14 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        if ((uVar34 >> 0x16 & 1) != 0) {
          pTVar29 = pTVar5;
        }
        pTVar27 = *(TValue **)(*(long *)(p_Var4 + (ulong)(byte)uVar21 * 8 + 0x20) + 0x10);
        pTVar29 = (StkId)((long)&pTVar29->value_ + (ulong)(uVar34 >> 10 & 0xff0));
        goto LAB_0011296d;
      case 9:
        pGVar19 = *(GCObject **)(p_Var4 + (ulong)(uVar34 >> 0x17) * 8 + 0x20);
        pTVar14 = (pGVar19->h).array;
        pTVar14->value_ = pTVar27->value_;
        pTVar14->tt_ = pTVar27->tt_;
        if ((((pTVar27->tt_ & 0x40) != 0) && (((((pTVar27->value_).gc)->gch).marked & 3) != 0)) &&
           (((pGVar19->gch).marked & 4) != 0)) {
          luaC_barrier_(L,pGVar19,(pTVar27->value_).gc);
        }
        break;
      case 10:
        pTVar14 = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          pTVar14 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        if ((uVar34 >> 0x16 & 1) != 0) {
          pTVar29 = pTVar5;
        }
        pTVar29 = (StkId)((long)&pTVar29->value_ + (ulong)(uVar34 >> 10 & 0xff0));
LAB_0011296d:
        luaV_settable(L,pTVar27,pTVar14,pTVar29);
        goto LAB_00112e5a;
      case 0xb:
        pGVar19 = (GCObject *)luaH_new(L);
        uVar21 = uVar34 >> 0xe & 0x1ff;
        (pTVar27->value_).gc = pGVar19;
        pTVar27->tt_ = 0x45;
        if (uVar21 != 0 || 0x7fffff < uVar34) {
          iVar12 = luaO_fb2int(uVar34 >> 0x17);
          iVar13 = luaO_fb2int(uVar21);
          luaH_resize(L,&pGVar19->h,iVar12,iVar13);
        }
        if (0 < L->l_G->GCdebt) {
          L->top = pTVar27 + 1;
          luaC_step(L);
          L->top = pCVar33->top;
        }
        pTVar29 = (pCVar33->u).l.base;
        break;
      case 0xc:
        uVar28 = (ulong)(uVar34 >> 0x13 & 0xfffffff0);
        pTVar14 = (TValue *)((long)&pTVar29->value_ + uVar28);
        pTVar27[1].value_ = *(Value *)((long)&pTVar29->value_ + uVar28);
        if ((uVar34 >> 0x16 & 1) != 0) {
          pTVar17 = pTVar5;
        }
        pTVar27[1].tt_ = *(int *)((long)&pTVar29->tt_ + uVar28);
LAB_0011285a:
        luaV_gettable(L,pTVar14,(TValue *)((long)&pTVar17->value_ + (ulong)(uVar34 >> 10 & 0xff0)),
                      pTVar27);
        goto LAB_00112e5a;
      case 0xd:
        rb = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        pTVar17 = pTVar5;
        if ((uVar34 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar29;
        }
        pTVar14 = (TValue *)((long)&pTVar17->value_ + (ulong)(uVar34 >> 10 & 0xff0));
        if ((rb->tt_ != 3) || (pTVar14->tt_ != 3)) {
          op = TM_ADD;
          goto LAB_00112e55;
        }
        lVar36 = (rb->value_).n + (pTVar14->value_).n;
LAB_001128dd:
        (pTVar27->value_).n = lVar36;
LAB_00112ab5:
        pTVar27->tt_ = 3;
        break;
      case 0xe:
        rb = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        pTVar17 = pTVar5;
        if ((uVar34 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar29;
        }
        pTVar14 = (TValue *)((long)&pTVar17->value_ + (ulong)(uVar34 >> 10 & 0xff0));
        if ((rb->tt_ == 3) && (pTVar14->tt_ == 3)) {
          lVar36 = (rb->value_).n - (pTVar14->value_).n;
          goto LAB_001128dd;
        }
        op = TM_SUB;
        goto LAB_00112e55;
      case 0xf:
        rb = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        pTVar17 = pTVar5;
        if ((uVar34 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar29;
        }
        pTVar14 = (TValue *)((long)&pTVar17->value_ + (ulong)(uVar34 >> 10 & 0xff0));
        if ((rb->tt_ == 3) && (pTVar14->tt_ == 3)) {
          lVar36 = (rb->value_).n * (pTVar14->value_).n;
          goto LAB_001128dd;
        }
        op = TM_MUL;
        goto LAB_00112e55;
      case 0x10:
        rb = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        pTVar17 = pTVar5;
        if ((uVar34 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar29;
        }
        pTVar14 = (TValue *)((long)&pTVar17->value_ + (ulong)(uVar34 >> 10 & 0xff0));
        if ((rb->tt_ == 3) && (pTVar14->tt_ == 3)) {
          lVar36 = (rb->value_).n / (pTVar14->value_).n;
          goto LAB_001128dd;
        }
        op = TM_DIV;
        goto LAB_00112e55;
      case 0x11:
        rb = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        pTVar17 = pTVar5;
        if ((uVar34 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar29;
        }
        pTVar14 = (TValue *)((long)&pTVar17->value_ + (ulong)(uVar34 >> 10 & 0xff0));
        if ((rb->tt_ == 3) && (pTVar14->tt_ == 3)) {
          dVar37 = (rb->value_).n;
          dVar2 = (pTVar14->value_).n;
          dVar35 = floor(dVar37 / dVar2);
          (pTVar27->value_).n = dVar37 - dVar35 * dVar2;
          goto LAB_00112ab5;
        }
        op = TM_MOD;
        goto LAB_00112e55;
      case 0x12:
        rb = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          rb = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        pTVar17 = pTVar5;
        if ((uVar34 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar29;
        }
        pTVar14 = (TValue *)((long)&pTVar17->value_ + (ulong)(uVar34 >> 10 & 0xff0));
        if ((rb->tt_ == 3) && (pTVar14->tt_ == 3)) {
          lVar36 = pow((rb->value_).n,(pTVar14->value_).n);
          goto LAB_001128dd;
        }
        op = TM_POW;
        goto LAB_00112e55;
      case 0x13:
        uVar28 = (ulong)(uVar34 >> 0x13 & 0xfffffff0);
        pTVar14 = (TValue *)((long)&pTVar29->value_ + uVar28);
        if (*(int *)((long)&pTVar29->tt_ + uVar28) == 3) {
          (pTVar27->value_).gc = (GCObject *)((ulong)(pTVar14->value_).gc ^ 0x8000000000000000);
          goto LAB_00112ab5;
        }
        op = TM_UNM;
        rb = pTVar14;
LAB_00112e55:
        luaV_arith(L,pTVar27,rb,pTVar14,op);
        goto LAB_00112e5a;
      case 0x14:
        uVar28 = (ulong)(uVar34 >> 0x13 & 0xfffffff0);
        iVar12 = *(int *)((long)&pTVar29->tt_ + uVar28);
        if (iVar12 == 0) {
          uVar34 = 1;
        }
        else if (iVar12 == 1) {
          uVar34 = (uint)(*(int *)((long)&pTVar29->value_ + uVar28) == 0);
        }
        else {
          uVar34 = 0;
        }
        *(uint *)&pTVar27->value_ = uVar34;
        pTVar27->tt_ = 1;
        break;
      case 0x15:
        luaV_objlen(L,pTVar27,
                    (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0)));
        goto LAB_00112e5a;
      case 0x16:
        uVar21 = uVar34 >> 0x17;
        uVar34 = uVar34 >> 0xe & 0x1ff;
        L->top = (StkId)((long)&pTVar29[1].value_ + (ulong)(uVar34 << 4));
        luaV_concat(L,(uVar34 - uVar21) + 1);
        pTVar29 = (pCVar33->u).l.base;
        uVar28 = (ulong)(uVar26 << 4);
        uVar22 = (ulong)(uVar21 << 4);
        *(undefined8 *)((long)&pTVar29->value_ + uVar28) =
             *(undefined8 *)((long)&pTVar29->value_ + uVar22);
        *(undefined4 *)((long)&pTVar29->tt_ + uVar28) =
             *(undefined4 *)((long)&pTVar29->tt_ + uVar22);
        if (0 < L->l_G->GCdebt) {
          pTVar17 = (StkId)((long)&pTVar29[1].value_ + uVar28);
          if (uVar26 < uVar21) {
            pTVar17 = (StkId)((long)&pTVar29->value_ + uVar22);
          }
          L->top = pTVar17;
          luaC_step(L);
          L->top = pCVar33->top;
        }
        pTVar29 = (pCVar33->u).l.base;
        L->top = pCVar33->top;
        break;
      case 0x17:
        if (uVar30 != 0) {
          luaF_close(L,(StkId)((long)&(pCVar33->u).l.base[-1].value_ + (ulong)(uVar26 << 4)));
        }
        goto LAB_00112ae6;
      case 0x18:
        pTVar27 = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        if ((uVar34 >> 0x16 & 1) != 0) {
          pTVar29 = pTVar5;
        }
        uVar28 = (ulong)(uVar34 >> 10 & 0xff0);
        uVar34 = 0;
        if (pTVar27->tt_ == *(int *)((long)&pTVar29->tt_ + uVar28)) {
          iVar12 = luaV_equalobj_(L,pTVar27,(TValue *)((long)&pTVar29->value_ + uVar28));
          uVar34 = (uint)(iVar12 != 0);
        }
        puVar15 = (pCVar33->u).l.savedpc;
        if (uVar34 == uVar30) {
          uVar34 = *puVar15;
          uVar21 = uVar34 >> 6 & 0xff;
          if (uVar21 != 0) {
            luaF_close(L,(StkId)((long)&(pCVar33->u).l.base[-1].value_ + (ulong)(uVar21 << 4)));
          }
          puVar15 = (pCVar33->u).l.savedpc + ((ulong)(uVar34 >> 0xe) - 0x1fffe);
        }
        else {
          puVar15 = puVar15 + 1;
        }
        (pCVar33->u).l.savedpc = puVar15;
        goto LAB_00112e5a;
      case 0x19:
        pTVar27 = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        if ((uVar34 >> 0x16 & 1) != 0) {
          pTVar29 = pTVar5;
        }
        uVar34 = luaV_lessthan(L,pTVar27,
                               (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 10 & 0xff0)));
        goto LAB_00112c47;
      case 0x1a:
        pTVar27 = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        if ((int)uVar34 < 0) {
          pTVar27 = (TValue *)((long)&pTVar5->value_ + (ulong)(uVar34 >> 0x13 & 0xff0));
        }
        if ((uVar34 >> 0x16 & 1) != 0) {
          pTVar29 = pTVar5;
        }
        uVar34 = luaV_lessequal(L,pTVar27,
                                (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 10 & 0xff0)));
LAB_00112c47:
        puVar15 = (pCVar33->u).l.savedpc;
        if (uVar34 == uVar30) {
          uVar34 = *puVar15;
          uVar21 = uVar34 >> 6 & 0xff;
          if (uVar21 != 0) {
            luaF_close(L,(StkId)((long)&(pCVar33->u).l.base[-1].value_ + (ulong)(uVar21 << 4)));
          }
          puVar15 = (pCVar33->u).l.savedpc + ((ulong)(uVar34 >> 0xe) - 0x1fffe);
        }
        else {
          puVar15 = puVar15 + 1;
        }
        (pCVar33->u).l.savedpc = puVar15;
        goto LAB_00112e5a;
      case 0x1b:
        iVar12 = pTVar27->tt_;
        if ((uVar34 & 0x7fc000) == 0) {
          if ((iVar12 == 0) || ((iVar12 == 1 && ((pTVar27->value_).b == 0)))) goto LAB_00112ee5;
        }
        else if ((iVar12 != 0) && ((iVar12 != 1 || ((pTVar27->value_).b != 0)))) {
LAB_00112ee5:
          uVar34 = *(pCVar33->u).l.savedpc;
          uVar21 = uVar34 >> 6 & 0xff;
          if (uVar21 != 0) {
            luaF_close(L,(StkId)((long)&(pCVar33->u).l.base[-1].value_ + (ulong)(uVar21 << 4)));
          }
          (pCVar33->u).l.savedpc = (pCVar33->u).l.savedpc + ((ulong)(uVar34 >> 0xe) - 0x1fffe);
          break;
        }
LAB_00112640:
        pp_Var1 = &(pCVar33->u).c.k;
        *pp_Var1 = *pp_Var1 + 4;
        break;
      case 0x1c:
        uVar28 = (ulong)(uVar34 >> 0x13 & 0xfffffff0);
        pVVar9 = (Value *)((long)&pTVar29->value_ + uVar28);
        iVar12 = *(int *)((long)&pTVar29->tt_ + uVar28);
        if ((uVar34 & 0x7fc000) == 0) {
          if ((iVar12 == 0) || ((iVar12 == 1 && (pVVar9->b == 0)))) goto LAB_00113016;
LAB_00113009:
          pcVar18 = (pCVar33->u).c.k + 4;
        }
        else {
          if ((iVar12 == 0) || ((iVar12 == 1 && (pVVar9->b == 0)))) goto LAB_00113009;
LAB_00113016:
          pTVar27->value_ = *pVVar9;
          pTVar27->tt_ = (&pVVar9->b)[2];
          uVar34 = *(pCVar33->u).l.savedpc;
          uVar21 = uVar34 >> 6 & 0xff;
          if (uVar21 != 0) {
            luaF_close(L,(StkId)((long)&(pCVar33->u).l.base[-1].value_ + (ulong)(uVar21 << 4)));
          }
          pcVar18 = (code *)((pCVar33->u).l.savedpc + ((ulong)(uVar34 >> 0xe) - 0x1fffe));
        }
        goto LAB_00112af8;
      case 0x1d:
        if (0x7fffff < uVar34) {
          L->top = (StkId)((long)&pTVar27->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        }
        uVar34 = uVar34 >> 0xe & 0x1ff;
        iVar13 = luaD_precall(L,pTVar27,uVar34 - 1);
        if (iVar13 == 0) {
          pCVar33 = L->ci;
          pCVar33->callstatus = pCVar33->callstatus | 4;
          iVar12 = 2;
        }
        else {
          if (uVar34 != 0) {
            L->top = pCVar33->top;
          }
          pTVar29 = (pCVar33->u).l.base;
          iVar12 = 0;
        }
        goto joined_r0x00112ff0;
      case 0x1e:
        if (0x7fffff < uVar34) {
          L->top = (StkId)((long)&pTVar27->value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        }
        iVar13 = luaD_precall(L,pTVar27,-1);
        if (iVar13 == 0) {
          pCVar6 = L->ci;
          pTVar17 = pCVar6->func;
          pCVar33 = pCVar6->previous;
          pTVar10 = pCVar33->func;
          pTVar31 = (pCVar6->u).l.base + *(byte *)(*(long *)((pTVar17->value_).f + 0x18) + 0x78);
          if (0 < *(int *)(*(long *)(p_Var4 + 0x18) + 0x60)) {
            luaF_close(L,(pCVar33->u).l.base);
          }
          if (pTVar17 < pTVar31) {
            piVar16 = &pTVar10->tt_;
            pTVar23 = pTVar17;
            do {
              ((TValue *)(piVar16 + -2))->value_ = pTVar23->value_;
              *piVar16 = pTVar23->tt_;
              pTVar23 = pTVar23 + 1;
              piVar16 = piVar16 + 4;
            } while (pTVar23 < pTVar31);
          }
          (pCVar33->u).l.base = (StkId)(((long)(pCVar6->u).l.base - (long)pTVar17) + (long)pTVar10);
          pTVar17 = (StkId)((long)L->top + ((long)pTVar10 - (long)pTVar17));
          L->top = pTVar17;
          pCVar33->top = pTVar17;
          (pCVar33->u).l.savedpc = (pCVar6->u).l.savedpc;
          pCVar33->callstatus = pCVar33->callstatus | 0x40;
          L->ci = pCVar33;
          iVar12 = 2;
        }
        else {
          pTVar29 = (pCVar33->u).l.base;
          iVar12 = 0;
        }
joined_r0x00112ff0:
        if (iVar13 != 0) break;
        goto LAB_00112e60;
      case 0x1f:
        if (0x7fffff < uVar34) {
          L->top = (StkId)((long)&pTVar27[-1].value_ + (ulong)(uVar34 >> 0x13 & 0xfffffff0));
        }
        if (0 < *(int *)(*(long *)(p_Var4 + 0x18) + 0x60)) {
          luaF_close(L,pTVar29);
        }
        iVar13 = luaD_poscall(L,pTVar27);
        iVar12 = 1;
        if ((pCVar33->callstatus & 4) != 0) {
          pCVar33 = L->ci;
          iVar12 = 2;
          if (iVar13 != 0) {
            L->top = pCVar33->top;
          }
        }
        goto LAB_00112e60;
      case 0x20:
        dVar37 = (pTVar27->value_).n + pTVar27[2].value_.n;
        if (pTVar27[2].value_.n <= 0.0) {
          if (pTVar27[1].value_.n <= dVar37) goto LAB_00112e12;
        }
        else if (dVar37 <= pTVar27[1].value_.n) {
LAB_00112e12:
          (pCVar33->u).l.savedpc = (pCVar33->u).l.savedpc + ((ulong)(uVar34 >> 0xe) - 0x1ffff);
          (pTVar27->value_).n = dVar37;
          pTVar27->tt_ = 3;
          pTVar27[3].value_.n = dVar37;
          pTVar27[3].tt_ = 3;
        }
        break;
      case 0x21:
        if ((pTVar27->tt_ != 3) &&
           (pTVar14 = luaV_tonumber(pTVar27,pTVar27), pTVar14 == (TValue *)0x0)) {
          fmt = "\'for\' initial value must be a number";
LAB_00113204:
          luaG_runerror(L,fmt);
        }
        if ((pTVar27[1].tt_ != 3) &&
           (pTVar14 = luaV_tonumber(pTVar27 + 1,pTVar27 + 1), pTVar14 == (TValue *)0x0)) {
          fmt = "\'for\' limit must be a number";
          goto LAB_00113204;
        }
        pTVar14 = pTVar27 + 2;
        if ((pTVar27[2].tt_ != 3) &&
           (pTVar14 = luaV_tonumber(pTVar14,pTVar14), pTVar14 == (TValue *)0x0)) {
          fmt = "\'for\' step must be a number";
          goto LAB_00113204;
        }
        (pTVar27->value_).n = (pTVar27->value_).n - (pTVar14->value_).n;
        pTVar27->tt_ = 3;
LAB_00112ae6:
        pcVar18 = (code *)((pCVar33->u).l.savedpc + ((ulong)(uVar34 >> 0xe) - 0x1ffff));
LAB_00112af8:
        (pCVar33->u).l.savedpc = (Instruction *)pcVar18;
        break;
      case 0x22:
        pTVar27[5].value_ = pTVar27[2].value_;
        pTVar27[5].tt_ = pTVar27[2].tt_;
        pTVar27[4].value_ = pTVar27[1].value_;
        pTVar27[4].tt_ = pTVar27[1].tt_;
        pTVar27[3].value_ = pTVar27->value_;
        pTVar27[3].tt_ = pTVar27->tt_;
        L->top = pTVar27 + 6;
        luaD_call(L,pTVar27 + 3,uVar34 >> 0xe & 0x1ff,1);
        pTVar29 = (pCVar33->u).l.base;
        L->top = pCVar33->top;
        puVar15 = (pCVar33->u).l.savedpc;
        (pCVar33->u).l.savedpc = puVar15 + 1;
        uVar34 = *puVar15;
        pTVar27 = (TValue *)((long)&pTVar29->value_ + (ulong)(uVar34 >> 2 & 0xff0));
      case 0x23:
        iVar12 = pTVar27[1].tt_;
        if (iVar12 != 0) {
          pTVar27->value_ = pTVar27[1].value_;
          pTVar27->tt_ = iVar12;
          goto LAB_00112ae6;
        }
        break;
      case 0x24:
        if (uVar34 < 0x800000) {
          uVar21 = (int)((ulong)((long)L->top - (long)pTVar27) >> 4) - 1;
        }
        else {
          uVar21 = uVar34 >> 0x17;
        }
        uVar34 = uVar34 >> 0xe & 0x1ff;
        if (uVar34 == 0) {
          puVar15 = (pCVar33->u).l.savedpc;
          (pCVar33->u).l.savedpc = puVar15 + 1;
          uVar34 = *puVar15 >> 6;
        }
        pGVar19 = (pTVar27->value_).gc;
        iVar12 = uVar34 * 0x32 + uVar21 + -0x32;
        if ((pGVar19->h).sizearray < iVar12) {
          luaH_resizearray(L,&pGVar19->h,iVar12);
        }
        if (0 < (int)uVar21) {
          pTVar27 = (TValue *)((long)&pTVar29[uVar21].value_ + (ulong)(uVar30 << 4));
          uVar28 = (ulong)uVar21;
          do {
            luaH_setint(L,&pGVar19->h,uVar34 * 0x32 + -0x32 + (int)uVar28,pTVar27);
            if ((((pTVar27->tt_ & 0x40) != 0) && (((byte)(pTVar27->value_).f[9] & 3) != 0)) &&
               (((pGVar19->gch).marked & 4) != 0)) {
              luaC_barrierback_(L,pGVar19);
            }
            pTVar27 = pTVar27 + -1;
            bVar11 = 1 < (long)uVar28;
            uVar28 = uVar28 - 1;
          } while (bVar11);
        }
        L->top = pCVar33->top;
        break;
      case 0x25:
        p = *(global_State **)
             (*(long *)(*(long *)(p_Var4 + 0x18) + 0x20) + (ulong)(uVar34 >> 0xe) * 8);
        pGVar19 = (p->l_registry).value_.gc;
        if ((pGVar19 != (GCObject *)0x0) && (0 < (long)(int)p->seed)) {
          pUVar8 = *(Upvaldesc **)&(p->strt).nuse;
          lVar32 = 0;
          do {
            bVar3 = (&pUVar8->idx)[lVar32 * 2];
            if ((&pUVar8->instack)[lVar32 * 2] == '\0') {
              pTVar17 = *(StkId *)(*(long *)(p_Var4 + (ulong)bVar3 * 8 + 0x20) + 0x10);
            }
            else {
              pTVar17 = pTVar29 + bVar3;
            }
            if (*(StkId *)(*(long *)((long)pGVar19 + lVar32 + 0x20) + 0x10) != pTVar17) {
              pGVar19 = (GCObject *)0x0;
              break;
            }
            lVar32 = lVar32 + 8;
          } while ((long)(int)p->seed * 8 != lVar32);
        }
        if (pGVar19 == (GCObject *)0x0) {
          uVar34 = p->seed;
          pUVar8 = *(Upvaldesc **)&(p->strt).nuse;
          pGVar19 = (GCObject *)luaF_newLclosure(L,uVar34);
          (pGVar19->th).l_G = p;
          (pTVar27->value_).gc = pGVar19;
          pTVar27->tt_ = 0x46;
          if (0 < (long)(int)uVar34) {
            lVar32 = 0;
            do {
              bVar3 = (&pUVar8->idx)[lVar32 * 2];
              if ((&pUVar8->instack)[lVar32 * 2] == '\0') {
                pUVar20 = *(UpVal **)(p_Var4 + (ulong)bVar3 * 8 + 0x20);
              }
              else {
                pUVar20 = luaF_findupval(L,pTVar29 + bVar3);
              }
              *(UpVal **)((long)pGVar19 + lVar32 + 0x20) = pUVar20;
              lVar32 = lVar32 + 8;
            } while ((long)(int)uVar34 * 8 != lVar32);
          }
          if (((ulong)p->ud & 0x400) != 0) {
            luaC_barrierproto_(L,(Proto *)p,&pGVar19->cl);
          }
          (p->l_registry).value_.gc = pGVar19;
        }
        else {
          (pTVar27->value_).gc = pGVar19;
          pTVar27->tt_ = 0x46;
        }
        if (0 < L->l_G->GCdebt) {
          L->top = pTVar27 + 1;
          luaC_step(L);
          L->top = pCVar33->top;
        }
LAB_00112e5a:
        pTVar29 = (pCVar33->u).l.base;
        break;
      case 0x26:
        uVar26 = ~(uint)*(byte *)(*(long *)(p_Var4 + 0x18) + 0x78) +
                 (int)((ulong)((long)pTVar29 - (long)pCVar33->func) >> 4);
        lVar32 = (long)(int)uVar26;
        if (uVar34 < 0x800000) {
          if ((long)L->stack_last - (long)L->top >> 4 <= lVar32) {
            luaD_growstack(L,uVar26);
          }
          pTVar29 = (pCVar33->u).l.base;
          pTVar27 = (TValue *)((long)&pTVar29->value_ + (ulong)((uVar21 & 0xff) << 4));
          L->top = pTVar27 + lVar32;
        }
        else {
          uVar26 = (uVar34 >> 0x17) - 1;
        }
        if (0 < (int)uVar26) {
          lVar24 = 8;
          uVar28 = 0;
          do {
            if ((long)uVar28 < lVar32) {
              *(undefined8 *)((long)pTVar27 + lVar24 + -8) =
                   *(undefined8 *)((long)pTVar29 + lVar24 + lVar32 * -0x10 + -8);
              *(undefined4 *)((long)&pTVar27->value_ + lVar24) =
                   *(undefined4 *)((long)&pTVar29[-lVar32].value_ + lVar24);
            }
            else {
              *(undefined4 *)((long)&pTVar27->value_ + lVar24) = 0;
            }
            uVar28 = uVar28 + 1;
            lVar24 = lVar24 + 0x10;
          } while (uVar26 != uVar28);
        }
      }
LAB_00112e5e:
      iVar12 = 0;
LAB_00112e60:
    } while (iVar12 == 0);
    if (iVar12 != 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_execute (lua_State *L) {
  CallInfo *ci = L->ci;
  LClosure *cl;
  TValue *k;
  StkId base;
 newframe:  /* reentry point when frame changes (call/return) */
  lua_assert(ci == L->ci);
  cl = clLvalue(ci->func);
  k = cl->p->k;
  base = ci->u.l.base;
  /* main loop of interpreter */
  for (;;) {
    Instruction i = *(ci->u.l.savedpc++);
    StkId ra;
    if ((L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) &&
        (--L->hookcount == 0 || L->hookmask & LUA_MASKLINE)) {
      Protect(traceexec(L));
    }
    /* WARNING: several calls may realloc the stack and invalidate `ra' */
    ra = RA(i);
    lua_assert(base == ci->u.l.base);
    lua_assert(base <= L->top && L->top < L->stack + L->stacksize);
    vmdispatch (GET_OPCODE(i)) {
      vmcase(OP_MOVE,
        setobjs2s(L, ra, RB(i));
      )
      vmcase(OP_LOADK,
        TValue *rb = k + GETARG_Bx(i);
        setobj2s(L, ra, rb);
      )
      vmcase(OP_LOADKX,
        TValue *rb;
        lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_EXTRAARG);
        rb = k + GETARG_Ax(*ci->u.l.savedpc++);
        setobj2s(L, ra, rb);
      )
      vmcase(OP_LOADBOOL,
        setbvalue(ra, GETARG_B(i));
        if (GETARG_C(i)) ci->u.l.savedpc++;  /* skip next instruction (if C) */
      )
      vmcase(OP_LOADNIL,
        int b = GETARG_B(i);
        do {
          setnilvalue(ra++);
        } while (b--);
      )
      vmcase(OP_GETUPVAL,
        int b = GETARG_B(i);
        setobj2s(L, ra, cl->upvals[b]->v);
      )
      vmcase(OP_GETTABUP,
        int b = GETARG_B(i);
        Protect(luaV_gettable(L, cl->upvals[b]->v, RKC(i), ra));
      )
      vmcase(OP_GETTABLE,
        Protect(luaV_gettable(L, RB(i), RKC(i), ra));
      )
      vmcase(OP_SETTABUP,
        int a = GETARG_A(i);
        Protect(luaV_settable(L, cl->upvals[a]->v, RKB(i), RKC(i)));
      )
      vmcase(OP_SETUPVAL,
        UpVal *uv = cl->upvals[GETARG_B(i)];
        setobj(L, uv->v, ra);
        luaC_barrier(L, uv, ra);
      )
      vmcase(OP_SETTABLE,
        Protect(luaV_settable(L, ra, RKB(i), RKC(i)));
      )
      vmcase(OP_NEWTABLE,
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        Table *t = luaH_new(L);
        sethvalue(L, ra, t);
        if (b != 0 || c != 0)
          luaH_resize(L, t, luaO_fb2int(b), luaO_fb2int(c));
        checkGC(L, ra + 1);
      )
      vmcase(OP_SELF,
        StkId rb = RB(i);
        setobjs2s(L, ra+1, rb);
        Protect(luaV_gettable(L, rb, RKC(i), ra));
      )
      vmcase(OP_ADD,
        arith_op(luai_numadd, TM_ADD);
      )
      vmcase(OP_SUB,
        arith_op(luai_numsub, TM_SUB);
      )
      vmcase(OP_MUL,
        arith_op(luai_nummul, TM_MUL);
      )
      vmcase(OP_DIV,
        arith_op(luai_numdiv, TM_DIV);
      )
      vmcase(OP_MOD,
        arith_op(luai_nummod, TM_MOD);
      )
      vmcase(OP_POW,
        arith_op(luai_numpow, TM_POW);
      )
      vmcase(OP_UNM,
        TValue *rb = RB(i);
        if (ttisnumber(rb)) {
          lua_Number nb = nvalue(rb);
          setnvalue(ra, luai_numunm(L, nb));
        }
        else {
          Protect(luaV_arith(L, ra, rb, rb, TM_UNM));
        }
      )
      vmcase(OP_NOT,
        TValue *rb = RB(i);
        int res = l_isfalse(rb);  /* next assignment may change this value */
        setbvalue(ra, res);
      )
      vmcase(OP_LEN,
        Protect(luaV_objlen(L, ra, RB(i)));
      )
      vmcase(OP_CONCAT,
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        StkId rb;
        L->top = base + c + 1;  /* mark the end of concat operands */
        Protect(luaV_concat(L, c - b + 1));
        ra = RA(i);  /* 'luav_concat' may invoke TMs and move the stack */
        rb = b + base;
        setobjs2s(L, ra, rb);
        checkGC(L, (ra >= rb ? ra + 1 : rb));
        L->top = ci->top;  /* restore top */
      )
      vmcase(OP_JMP,
        dojump(ci, i, 0);
      )
      vmcase(OP_EQ,
        TValue *rb = RKB(i);
        TValue *rc = RKC(i);
        Protect(
          if (cast_int(equalobj(L, rb, rc)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_LT,
        Protect(
          if (luaV_lessthan(L, RKB(i), RKC(i)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_LE,
        Protect(
          if (luaV_lessequal(L, RKB(i), RKC(i)) != GETARG_A(i))
            ci->u.l.savedpc++;
          else
            donextjump(ci);
        )
      )
      vmcase(OP_TEST,
        if (GETARG_C(i) ? l_isfalse(ra) : !l_isfalse(ra))
            ci->u.l.savedpc++;
          else
          donextjump(ci);
      )
      vmcase(OP_TESTSET,
        TValue *rb = RB(i);
        if (GETARG_C(i) ? l_isfalse(rb) : !l_isfalse(rb))
          ci->u.l.savedpc++;
        else {
          setobjs2s(L, ra, rb);
          donextjump(ci);
        }
      )
      vmcase(OP_CALL,
        int b = GETARG_B(i);
        int nresults = GETARG_C(i) - 1;
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        if (luaD_precall(L, ra, nresults)) {  /* C function? */
          if (nresults >= 0) L->top = ci->top;  /* adjust results */
          base = ci->u.l.base;
        }
        else {  /* Lua function */
          ci = L->ci;
          ci->callstatus |= CIST_REENTRY;
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcase(OP_TAILCALL,
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        lua_assert(GETARG_C(i) - 1 == LUA_MULTRET);
        if (luaD_precall(L, ra, LUA_MULTRET))  /* C function? */
          base = ci->u.l.base;
        else {
          /* tail call: put called frame (n) in place of caller one (o) */
          CallInfo *nci = L->ci;  /* called frame */
          CallInfo *oci = nci->previous;  /* caller frame */
          StkId nfunc = nci->func;  /* called function */
          StkId ofunc = oci->func;  /* caller function */
          /* last stack slot filled by 'precall' */
          StkId lim = nci->u.l.base + getproto(nfunc)->numparams;
          int aux;
          /* close all upvalues from previous call */
          if (cl->p->sizep > 0) luaF_close(L, oci->u.l.base);
          /* move new frame into old one */
          for (aux = 0; nfunc + aux < lim; aux++)
            setobjs2s(L, ofunc + aux, nfunc + aux);
          oci->u.l.base = ofunc + (nci->u.l.base - nfunc);  /* correct base */
          oci->top = L->top = ofunc + (L->top - nfunc);  /* correct top */
          oci->u.l.savedpc = nci->u.l.savedpc;
          oci->callstatus |= CIST_TAIL;  /* function was tail called */
          ci = L->ci = oci;  /* remove new frame */
          lua_assert(L->top == oci->u.l.base + getproto(ofunc)->maxstacksize);
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcasenb(OP_RETURN,
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b-1;
        if (cl->p->sizep > 0) luaF_close(L, base);
        b = luaD_poscall(L, ra);
        if (!(ci->callstatus & CIST_REENTRY))  /* 'ci' still the called one */
          return;  /* external invocation: return */
        else {  /* invocation via reentry: continue execution */
          ci = L->ci;
          if (b) L->top = ci->top;
          lua_assert(isLua(ci));
          lua_assert(GET_OPCODE(*((ci)->u.l.savedpc - 1)) == OP_CALL);
          goto newframe;  /* restart luaV_execute over new Lua function */
        }
      )
      vmcase(OP_FORLOOP,
        lua_Number step = nvalue(ra+2);
        lua_Number idx = luai_numadd(L, nvalue(ra), step); /* increment index */
        lua_Number limit = nvalue(ra+1);
        if (luai_numlt(L, 0, step) ? luai_numle(L, idx, limit)
                                   : luai_numle(L, limit, idx)) {
          ci->u.l.savedpc += GETARG_sBx(i);  /* jump back */
          setnvalue(ra, idx);  /* update internal index... */
          setnvalue(ra+3, idx);  /* ...and external index */
        }
      )
      vmcase(OP_FORPREP,
        const TValue *init = ra;
        const TValue *plimit = ra+1;
        const TValue *pstep = ra+2;
        if (!tonumber(init, ra))
          luaG_runerror(L, LUA_QL("for") " initial value must be a number");
        else if (!tonumber(plimit, ra+1))
          luaG_runerror(L, LUA_QL("for") " limit must be a number");
        else if (!tonumber(pstep, ra+2))
          luaG_runerror(L, LUA_QL("for") " step must be a number");
        setnvalue(ra, luai_numsub(L, nvalue(ra), nvalue(pstep)));
        ci->u.l.savedpc += GETARG_sBx(i);
      )
      vmcasenb(OP_TFORCALL,
        StkId cb = ra + 3;  /* call base */
        setobjs2s(L, cb+2, ra+2);
        setobjs2s(L, cb+1, ra+1);
        setobjs2s(L, cb, ra);
        L->top = cb + 3;  /* func. + 2 args (state and index) */
        Protect(luaD_call(L, cb, GETARG_C(i), 1));
        L->top = ci->top;
        i = *(ci->u.l.savedpc++);  /* go to next instruction */
        ra = RA(i);
        lua_assert(GET_OPCODE(i) == OP_TFORLOOP);
        goto l_tforloop;
      )
      vmcase(OP_TFORLOOP,
        l_tforloop:
        if (!ttisnil(ra + 1)) {  /* continue loop? */
          setobjs2s(L, ra, ra + 1);  /* save control variable */
           ci->u.l.savedpc += GETARG_sBx(i);  /* jump back */
        }
      )
      vmcase(OP_SETLIST,
        int n = GETARG_B(i);
        int c = GETARG_C(i);
        int last;
        Table *h;
        if (n == 0) n = cast_int(L->top - ra) - 1;
        if (c == 0) {
          lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_EXTRAARG);
          c = GETARG_Ax(*ci->u.l.savedpc++);
        }
        luai_runtimecheck(L, ttistable(ra));
        h = hvalue(ra);
        last = ((c-1)*LFIELDS_PER_FLUSH) + n;
        if (last > h->sizearray)  /* needs more space? */
          luaH_resizearray(L, h, last);  /* pre-allocate it at once */
        for (; n > 0; n--) {
          TValue *val = ra+n;
          luaH_setint(L, h, last--, val);
          luaC_barrierback(L, obj2gco(h), val);
        }
        L->top = ci->top;  /* correct top (in case of previous open call) */
      )
      vmcase(OP_CLOSURE,
        Proto *p = cl->p->p[GETARG_Bx(i)];
        Closure *ncl = getcached(p, cl->upvals, base);  /* cached closure */
        if (ncl == NULL)  /* no match? */
          pushclosure(L, p, cl->upvals, base, ra);  /* create a new one */
        else
          setclLvalue(L, ra, ncl);  /* push cashed closure */
        checkGC(L, ra + 1);
      )
      vmcase(OP_VARARG,
        int b = GETARG_B(i) - 1;
        int j;
        int n = cast_int(base - ci->func) - cl->p->numparams - 1;
        if (b < 0) {  /* B == 0? */
          b = n;  /* get all var. arguments */
          Protect(luaD_checkstack(L, n));
          ra = RA(i);  /* previous call may change the stack */
          L->top = ra + n;
        }
        for (j = 0; j < b; j++) {
          if (j < n) {
            setobjs2s(L, ra + j, base - n + j);
          }
          else {
            setnilvalue(ra + j);
          }
        }
      )
      vmcase(OP_EXTRAARG,
        lua_assert(0);
      )
    }
  }
}